

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateModelLevelFeatureDescriptionsAreEmpty
                   (Result *__return_storage_ptr__,ModelDescription *interface)

{
  allocator<char> local_29;
  string local_28;
  
  if ((interface->input_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    if ((interface->output_).super_RepeatedPtrFieldBase.current_size_ == 0) {
      if ((interface->state_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        if (*(long *)(((ulong)(interface->predictedfeaturename_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8) == 0) {
          if (*(long *)(((ulong)(interface->predictedprobabilitiesname_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8) == 0) {
            if ((interface->traininginput_).super_RepeatedPtrFieldBase.current_size_ == 0) {
              Result::Result(__return_storage_ptr__);
              return __return_storage_ptr__;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_28,
                       "Multi-function model must not use top level training input feature description."
                       ,&local_29);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_28);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_28,
                       "Multi-function model must not use top level predictedProbabilitiesName field."
                       ,&local_29);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_28);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_28,
                     "Multi-function model must not use top level predictedFeatureName field.",
                     &local_29);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_28);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_28,
                   "Multi-function model must not use top level state feature description.",
                   &local_29);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_28);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,
                 "Multi-function model must not use top level output feature description.",&local_29
                );
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_28);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,
               "Multi-function model must not use top level input feature description.",&local_29);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateModelLevelFeatureDescriptionsAreEmpty(const Specification::ModelDescription& interface) {
        if (interface.input_size() != 0) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level input feature description.");
        }

        if (interface.output_size() != 0) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level output feature description.");
        }

        if (interface.state_size() != 0) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level state feature description.");
        }

        if (!interface.predictedfeaturename().empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level predictedFeatureName field.");
        }

        if (!interface.predictedprobabilitiesname().empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level predictedProbabilitiesName field.");
        }

        if (!interface.traininginput().empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level training input feature description.");
        }

        return Result();
    }